

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.hpp
# Opt level: O0

container<pstore::repo::internal_fixup> __thiscall
pstore::repo::section_dispatcher::ifixups(section_dispatcher *this)

{
  container<pstore::repo::internal_fixup> cVar1;
  section_dispatcher *this_local;
  
  cVar1 = generic_section::ifixups(this->s_);
  return cVar1;
}

Assistant:

container<internal_fixup> ifixups () const final { return s_.ifixups (); }